

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32_t num,string *s,uint8_t *ptr)

{
  uint size_00;
  byte *pbVar1;
  LogMessage *other;
  void *data;
  uint8_t *puVar2;
  uint32_t size;
  uint8_t *ptr_local;
  string *s_local;
  uint32_t num_local;
  EpsCopyOutputStream *this_local;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  byte *local_48;
  uint local_40;
  uint32_t local_3c;
  EpsCopyOutputStream *local_38;
  byte *local_30;
  uint local_24;
  byte *local_20;
  uint local_14;
  byte *local_10;
  
  pbVar1 = EnsureSpace(this,ptr);
  size_00 = std::__cxx11::string::size();
  local_40 = 2;
  local_81 = 0;
  local_48 = pbVar1;
  local_3c = num;
  local_38 = this;
  if (this->end_ <= pbVar1) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x36d);
    local_81 = 1;
    other = internal::LogMessage::operator<<(&local_80,"CHECK failed: ptr < end_: ");
    internal::LogFinisher::operator=(local_95,other);
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_80);
  }
  local_14 = local_3c << 3 | local_40;
  local_20 = local_48;
  *local_48 = (byte)local_14;
  if (local_14 < 0x80) {
    local_10 = local_48 + 1;
  }
  else {
    *local_48 = *local_48 | 0x80;
    local_14 = local_14 >> 7;
    local_48[1] = (byte)local_14;
    if (local_14 < 0x80) {
      local_10 = local_48 + 2;
    }
    else {
      local_20 = local_48 + 2;
      do {
        local_20[-1] = local_20[-1] | 0x80;
        local_14 = local_14 >> 7;
        *local_20 = (byte)local_14;
        local_20 = local_20 + 1;
        local_10 = local_20;
      } while (0x7f < local_14);
    }
  }
  local_30 = local_10;
  for (local_24 = size_00; 0x7f < local_24; local_24 = local_24 >> 7) {
    *local_30 = (byte)local_24 | 0x80;
    local_30 = local_30 + 1;
  }
  pbVar1 = local_30 + 1;
  *local_30 = (byte)local_24;
  local_30 = pbVar1;
  data = (void *)std::__cxx11::string::data();
  puVar2 = WriteRaw(this,data,size_00,pbVar1);
  return puVar2;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringOutline(uint32_t num, const std::string& s,
                                               uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}